

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::writeImageSamplerDescriptorSet
          (ImageSampleComputeInstance *this,VkDescriptorSet descriptorSet)

{
  DescriptorSetUpdateBuilder *this_00;
  ShaderInputInterface SVar1;
  VkDescriptorImageInfo *pImageInfo;
  Location local_80;
  VkDescriptorImageInfo imageSamplers [2];
  VkDescriptorBufferInfo resultInfo;
  
  resultInfo.buffer.m_internal =
       (this->m_result).m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  resultInfo.offset = 0;
  resultInfo.range = 0x40;
  if ((this->m_isImmutableSampler & this->m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) == 0
     ) {
    imageSamplers[0].sampler.m_internal =
         (this->m_images).m_samplerA.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
         m_internal;
    imageSamplers[1].sampler.m_internal =
         (this->m_images).m_samplerB.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
         m_internal;
  }
  else {
    imageSamplers[0].sampler.m_internal = 0;
    imageSamplers[1].sampler.m_internal = 0;
  }
  imageSamplers[0].imageView.m_internal =
       (this->m_images).super_ImageInstanceImages.m_imageViewA.
       super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  imageSamplers[0].imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  imageSamplers[1].imageView.m_internal =
       (this->m_images).super_ImageInstanceImages.m_imageViewB.
       super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  this_00 = &this->m_updateBuilder;
  local_80.m_binding = 0;
  local_80.m_arrayElement = 0;
  imageSamplers[1].imageLayout = imageSamplers[0].imageLayout;
  ::vk::DescriptorSetUpdateBuilder::writeSingle
            (this_00,descriptorSet,&local_80,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&resultInfo);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    local_80.m_binding = 1;
    local_80.m_arrayElement = 0;
    ::vk::DescriptorSetUpdateBuilder::writeArray
              (this_00,descriptorSet,&local_80,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,2,
               imageSamplers);
  }
  else {
    if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      pImageInfo = imageSamplers + 1;
      local_80.m_binding = 1;
      local_80.m_arrayElement = 0;
      ::vk::DescriptorSetUpdateBuilder::writeSingle
                (this_00,descriptorSet,&local_80,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
                 imageSamplers);
      local_80.m_binding = 2;
      local_80.m_arrayElement = 0;
    }
    else {
      if (SVar1 != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_00541e1a;
      local_80.m_binding = 1;
      local_80.m_arrayElement = 0;
      pImageInfo = imageSamplers;
    }
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (this_00,descriptorSet,&local_80,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,pImageInfo)
    ;
  }
LAB_00541e1a:
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    ::vk::DescriptorSetUpdateBuilder::update(this_00,this->m_vki,this->m_device);
  }
  return;
}

Assistant:

void ImageSampleComputeInstance::writeImageSamplerDescriptorSet (vk::VkDescriptorSet descriptorSet)
{
	const vk::VkDescriptorBufferInfo	resultInfo			= vk::makeDescriptorBufferInfo(m_result.getBuffer(), 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkSampler					samplers[2]			=
	{
		(m_isImmutableSampler && (m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) ? (0) : (m_images.getSamplerA()),
		(m_isImmutableSampler && (m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) ? (0) : (m_images.getSamplerB()),
	};
	const vk::VkDescriptorImageInfo		imageSamplers[2]	=
	{
		makeDescriptorImageInfo(samplers[0], m_images.getImageViewA(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
		makeDescriptorImageInfo(samplers[1], m_images.getImageViewB(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	};

	// result
	m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultInfo);

	// combined image samplers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageSamplers[0]);
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageSamplers[0]);
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(2u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageSamplers[1]);
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			m_updateBuilder.writeArray(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 2u, imageSamplers);
			break;

		default:
			DE_FATAL("Impossible");
	}

	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		m_updateBuilder.update(m_vki, m_device);
	}
}